

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  Type *pTVar4;
  LogMessage *pLVar5;
  LogFinisher local_91;
  LogMessage local_90;
  LogMessage local_58;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x498);
    pLVar5 = LogMessage::operator<<(&local_58,"CHECK failed: GetArena() == nullptr: ");
    pLVar5 = LogMessage::operator<<
                       (pLVar5,"ReleaseLast() called on a RepeatedPtrField that is on an arena, ");
    pLVar5 = LogMessage::operator<<
                       (pLVar5,"with a type that does not implement MergeFrom. This is unsafe; ");
    pLVar5 = LogMessage::operator<<(pLVar5,"please implement MergeFrom for your type.");
    LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
    LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ < 1) {
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4a2);
    pLVar5 = LogMessage::operator<<(&local_90,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_91,pLVar5);
    LogMessage::~LogMessage(&local_90);
  }
  pRVar3 = this->rep_;
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + -1;
  pTVar4 = (Type *)pRVar3->elements[(long)iVar1 + -1];
  iVar2 = pRVar3->allocated_size;
  pRVar3->allocated_size = iVar2 + -1;
  if (iVar1 < iVar2) {
    pRVar3->elements[(long)iVar1 + -1] = pRVar3->elements[(long)iVar2 + -1];
  }
  return pTVar4;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseLastInternal(
    std::false_type) {
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "ReleaseLast() called on a RepeatedPtrField that is on an arena, "
      << "with a type that does not implement MergeFrom. This is unsafe; "
      << "please implement MergeFrom for your type.";
  return UnsafeArenaReleaseLast<TypeHandler>();
}